

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall UtestShellPointerArray::shuffle(UtestShellPointerArray *this,size_t seed)

{
  UtestShell **ppUVar1;
  UtestShell *pUVar2;
  int iVar3;
  size_t sVar4;
  
  if (this->count_ != 0) {
    (*PlatformSpecificSrand)((uint)seed);
    sVar4 = this->count_;
    while( true ) {
      if (sVar4 == 1) {
        relinkTestsInOrder(this);
        return;
      }
      if (this->count_ == 0) break;
      iVar3 = (*PlatformSpecificRand)();
      ppUVar1 = this->arrayOfTests_;
      pUVar2 = ppUVar1[sVar4 - 1];
      ppUVar1[sVar4 - 1] = ppUVar1[(ulong)(long)iVar3 % sVar4];
      this->arrayOfTests_[(ulong)(long)iVar3 % sVar4] = pUVar2;
      sVar4 = sVar4 - 1;
    }
  }
  return;
}

Assistant:

void UtestShellPointerArray::shuffle(size_t seed)
{
    if (count_ == 0) return;

    PlatformSpecificSrand((unsigned int) seed);

    for (size_t i = count_ - 1; i >= 1; --i)
    {
        if (count_ == 0) return;

        const size_t j = ((size_t)PlatformSpecificRand()) % (i + 1); // distribution biased by modulo, but good enough for shuffling
        swap(i, j);
   }
   relinkTestsInOrder();
}